

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void disassemble_binary(ifstream *in,ostream *out)

{
  File f;
  File local_60;
  
  File::parse_file_binary(&local_60,in);
  File::output_text(&local_60,out);
  File::~File(&local_60);
  return;
}

Assistant:

void disassemble_binary(std::ifstream* in, std::ostream* out) {
    try {
        File f = File::parse_file_binary(*in);
        f.output_text(*out);
    }
    catch (const std::exception& e) {
        println(std::cerr, e.what());
    }
}